

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O3

bool __thiscall
boost::runtime::value_interpreter<bool,_false>::interpret
          (value_interpreter<bool,_false> *this,cstring *param_name,cstring *source)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  size_t n;
  undefined **local_c0;
  iterator local_b8;
  iterator pvStack_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_88;
  format_error local_50;
  
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_YES == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_Y == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_NO == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_N == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_TRUE == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_FALSE == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_one == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_zero == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  pbVar2 = (byte *)source->m_begin;
  pbVar4 = (byte *)source->m_end;
  pbVar3 = pbVar2;
  while (((pbVar2 != pbVar4 && (pbVar3 = pbVar2, (ulong)*pbVar2 < 0x21)) &&
         ((0x100000600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
    pbVar3 = pbVar4;
  }
  pbVar2 = pbVar4;
  if (pbVar3 < pbVar4) {
    pbVar2 = pbVar3;
  }
  source->m_begin = (iterator)pbVar2;
  pbVar5 = pbVar4;
  if (pbVar3 < pbVar4) {
    do {
      pbVar5 = pbVar4;
      if ((0x20 < (ulong)pbVar4[-1]) || ((0x100000600U >> ((ulong)pbVar4[-1] & 0x3f) & 1) == 0))
      break;
      pbVar4 = pbVar4 + -1;
      pbVar5 = pbVar3;
    } while (pbVar4 != pbVar2);
  }
  source->m_end = (iterator)pbVar5;
  if (pbVar5 <= pbVar2) {
    source->m_begin = (iterator)pbVar5;
    pbVar2 = pbVar5;
  }
  n = (long)pbVar5 - (long)pbVar2;
  if (n == 0) {
    return true;
  }
  if (n == (long)interpret::s_YES.m_end - (long)interpret::s_YES.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_YES.m_begin,n);
    if (iVar1 == 0) {
      return true;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_Y.m_end - (long)interpret::s_Y.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_Y.m_begin,n);
    if (iVar1 == 0) {
      return true;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_one.m_end - (long)interpret::s_one.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_one.m_begin,n);
    if (iVar1 == 0) {
      return true;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_TRUE.m_end - (long)interpret::s_TRUE.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_TRUE.m_begin,n);
    if (iVar1 == 0) {
      return true;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_NO.m_end - (long)interpret::s_NO.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_NO.m_begin,n);
    if (iVar1 == 0) {
      return false;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_N.m_end - (long)interpret::s_N.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_N.m_begin,n);
    if (iVar1 == 0) {
      return false;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if (n == (long)interpret::s_zero.m_end - (long)interpret::s_zero.m_begin) {
    iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                      ((char *)pbVar2,interpret::s_zero.m_begin,n);
    if (iVar1 == 0) {
      return false;
    }
    pbVar2 = (byte *)source->m_begin;
    n = (long)source->m_end - (long)pbVar2;
  }
  if ((n == (long)interpret::s_FALSE.m_end - (long)interpret::s_FALSE.m_begin) &&
     (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                        ((char *)pbVar2,interpret::s_FALSE.m_begin,n), iVar1 == 0)) {
    return false;
  }
  local_b8 = param_name->m_begin;
  pvStack_b0 = param_name->m_end;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  local_c0 = &PTR__param_error_001ca150;
  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
            ((format_error *)&local_88,
             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *)
             &local_c0,source);
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
            (&local_50,&local_88," can\'t be interpreted as bool value.");
  unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_50);
}

Assistant:

bool    interpret( cstring param_name, cstring source ) const
    {
        static cstring const s_YES( "YES" );
        static cstring const s_Y( "Y" );
        static cstring const s_NO( "NO" );
        static cstring const s_N( "N" );
        static cstring const s_TRUE( "TRUE" );
        static cstring const s_FALSE( "FALSE" );
        static cstring const s_one( "1" );
        static cstring const s_zero( "0" );

        source.trim();

        if( source.is_empty() ||
            case_ins_eq( source, s_YES ) ||
            case_ins_eq( source, s_Y ) ||
            case_ins_eq( source, s_one ) ||
            case_ins_eq( source, s_TRUE ) )
            return true;

        if( case_ins_eq( source, s_NO ) ||
            case_ins_eq( source, s_N ) ||
            case_ins_eq( source, s_zero ) ||
            case_ins_eq( source, s_FALSE ) )
            return false;

        BOOST_TEST_I_THROW( format_error( param_name ) << source << " can't be interpreted as bool value." );
    }